

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_WriteGate(FILE *pFile,Mio_Gate_t *pGate,int GateLen,int NameLen,int FormLen,int fPrintSops,
                  int fAllPins)

{
  uint uVar1;
  char *local_13d8;
  Mio_Pin_t *local_13c0;
  Mio_Pin_t *pPin;
  char Buffer [5000];
  int fPrintSops_local;
  int FormLen_local;
  int NameLen_local;
  int GateLen_local;
  Mio_Gate_t *pGate_local;
  FILE *pFile_local;
  
  if (4999 < NameLen + FormLen + 2) {
    __assert_fail("NameLen+FormLen+2 < 5000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                  ,0xe5,"void Mio_WriteGate(FILE *, Mio_Gate_t *, int, int, int, int, int)");
  }
  sprintf((char *)&pPin,"%s=%s;",pGate->pOutName,pGate->pForm);
  fprintf((FILE *)pFile,"GATE %-*s ",(ulong)(uint)GateLen,pGate->pName);
  fprintf((FILE *)pFile,"%8.2f  ",pGate->dArea);
  uVar1 = Abc_MinInt(NameLen + FormLen + 2,0x3c);
  fprintf((FILE *)pFile,"%-*s ",(ulong)uVar1);
  if (fPrintSops != 0) {
    if (pGate->pSop == (char *)0x0) {
      local_13d8 = "unspecified\n";
    }
    else {
      local_13d8 = pGate->pSop;
    }
    fprintf((FILE *)pFile,"%s",local_13d8);
  }
  if ((fAllPins == 0) || (pGate->pPins == (Mio_Pin_t *)0x0)) {
    for (local_13c0 = Mio_GateReadPins(pGate); local_13c0 != (Mio_Pin_t *)0x0;
        local_13c0 = Mio_PinReadNext(local_13c0)) {
      Mio_WritePin(pFile,local_13c0,NameLen,0);
    }
  }
  else {
    Mio_WritePin(pFile,pGate->pPins,NameLen,1);
  }
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Mio_WriteGate( FILE * pFile, Mio_Gate_t * pGate, int GateLen, int NameLen, int FormLen, int fPrintSops, int fAllPins )
{
    char Buffer[5000];
    Mio_Pin_t * pPin;
    assert( NameLen+FormLen+2 < 5000 );
    sprintf( Buffer, "%s=%s;",    pGate->pOutName, pGate->pForm );
    fprintf( pFile, "GATE %-*s ", GateLen, pGate->pName );
    fprintf( pFile, "%8.2f  ",    pGate->dArea );
    fprintf( pFile, "%-*s ",      Abc_MinInt(NameLen+FormLen+2, 60), Buffer );
    // print the pins
    if ( fPrintSops )
        fprintf( pFile, "%s",       pGate->pSop? pGate->pSop : "unspecified\n" );
    if ( fAllPins && pGate->pPins ) // equal pins
        Mio_WritePin( pFile, pGate->pPins, NameLen, 1 );
    else // different pins
        Mio_GateForEachPin( pGate, pPin )
            Mio_WritePin( pFile, pPin, NameLen, 0 );
    fprintf( pFile, "\n" );
}